

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O0

Gia_Iso2Man_t * Gia_Iso2ManStart(Gia_Man_t *pGia)

{
  int iVar1;
  Gia_Iso2Man_t *pGVar2;
  Vec_Int_t *pVVar3;
  Vec_Ptr_t *pVVar4;
  Gia_Iso2Man_t *p;
  Gia_Man_t *pGia_local;
  
  pGVar2 = (Gia_Iso2Man_t *)calloc(1,0x90);
  pGVar2->pGia = pGia;
  iVar1 = Gia_ManObjNum(pGia);
  pGVar2->nObjs = iVar1;
  pGVar2->nUniques = 0;
  pVVar3 = Vec_IntStartFull(pGVar2->nObjs);
  pGVar2->vUniques = pVVar3;
  pVVar3 = Gia_Iso2ManCollectTies(pGia);
  pGVar2->vTied = pVVar3;
  iVar1 = Abc_PrimeCudd(pGVar2->nObjs);
  pVVar3 = Vec_IntStart(iVar1);
  pGVar2->vTable = pVVar3;
  pVVar3 = Vec_IntAlloc(1000);
  pGVar2->vPlaces = pVVar3;
  pVVar4 = Vec_PtrAlloc(1000);
  pGVar2->vSingles = pVVar4;
  pVVar3 = Vec_IntAlloc(10000);
  pGVar2->vVec0 = pVVar3;
  pVVar3 = Vec_IntAlloc(10000);
  pGVar2->vVec1 = pVVar3;
  pVVar3 = Vec_IntStart(pGVar2->nObjs);
  pGVar2->vMap0 = pVVar3;
  pVVar3 = Vec_IntStart(pGVar2->nObjs);
  pGVar2->vMap1 = pVVar3;
  iVar1 = pGVar2->nUniques;
  pGVar2->nUniques = iVar1 + 1;
  Vec_IntWriteEntry(pGVar2->vUniques,0,iVar1);
  return pGVar2;
}

Assistant:

Gia_Iso2Man_t * Gia_Iso2ManStart( Gia_Man_t * pGia )
{
    Gia_Iso2Man_t * p;
    p = ABC_CALLOC( Gia_Iso2Man_t, 1 );
    p->pGia      = pGia;
    p->nObjs     = Gia_ManObjNum( pGia );
    p->nUniques  = 0;
    // internal data
    p->vUniques  = Vec_IntStartFull( p->nObjs );
    p->vTied     = Gia_Iso2ManCollectTies( pGia );
    p->vTable    = Vec_IntStart( Abc_PrimeCudd(1*p->nObjs) );
    p->vPlaces   = Vec_IntAlloc( 1000 );
    p->vSingles  = Vec_PtrAlloc( 1000 );
    p->vVec0     = Vec_IntAlloc( 10000 );
    p->vVec1     = Vec_IntAlloc( 10000 );
    p->vMap0     = Vec_IntStart( p->nObjs );
    p->vMap1     = Vec_IntStart( p->nObjs );
    // add constant 0 object
    Vec_IntWriteEntry( p->vUniques, 0, p->nUniques++ );
    return p;
}